

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool __thiscall AnyType::OutputFromType<OctetString>(AnyType *this,wostream *os)

{
  bool bVar1;
  undefined1 local_48 [8];
  OctetString t;
  
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_48 = (undefined1  [8])&PTR_EncodedSize_00146a80;
  t.super_DerBase.cbData = 0;
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = ConvertToType<OctetString>(this,(OctetString *)local_48);
  if (bVar1) {
    ::operator<<(os,(OctetString *)local_48);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&t.super_DerBase.cbData)
  ;
  return bVar1;
}

Assistant:

bool OutputFromType(std::wostream& os) const
	{
		T t;
		bool fConverted = ConvertToType(t);
		if (fConverted)
			os << t;

		return fConverted;
	}